

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void processMSG(UA_Server *server,UA_SecureChannel *channel,UA_UInt32 requestId,UA_ByteString *msg)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  UA_Logger p_Var7;
  UA_SecureChannel *pUVar8;
  undefined8 uVar9;
  long lVar10;
  UA_UInt32 UVar11;
  code *pcVar12;
  UA_StatusCode UVar13;
  UA_Session *session;
  UA_DateTime UVar14;
  char *pcVar15;
  UA_DataType *pUVar16;
  ulong uVar17;
  size_t sVar18;
  UA_CreateSessionRequest *response;
  UA_CreateSessionRequest *request;
  UA_DataType *pUVar19;
  UA_SessionManager *pUVar20;
  ulong uVar21;
  uint uVar22;
  UA_Server *server_00;
  UA_String *pUStack_230;
  size_t sStack_228;
  UA_Byte *pUStack_220;
  size_t sStack_218;
  UA_Byte *pUStack_210;
  size_t sStack_208;
  UA_Byte *pUStack_200;
  size_t sStack_1f8;
  UA_Byte *pUStack_1f0;
  size_t sStack_1e8;
  UA_Byte *pUStack_1e0;
  UA_Double UStack_1d8;
  UA_UInt32 aUStack_1d0 [2];
  undefined1 local_1c8 [16];
  size_t local_1b8;
  UA_Byte *pUStack_1b0;
  UA_UInt32 local_1a8 [2];
  UA_Byte *pUStack_1a0;
  size_t local_198;
  UA_Byte *pUStack_190;
  undefined8 local_188;
  size_t sStack_180;
  UA_Byte *local_178;
  size_t sStack_170;
  UA_Byte *pUStack_168;
  undefined1 uStack_160;
  undefined7 local_15f;
  undefined1 uStack_158;
  undefined8 uStack_157;
  size_t local_148;
  UA_Byte *pUStack_140;
  UA_NodeId local_138;
  UA_NodeId UStack_120;
  undefined8 local_108;
  UA_Double UStack_100;
  UA_DateTime local_f8;
  UA_SecureChannel *local_f0;
  UA_UInt16 local_e8;
  ContinuationPointList local_e0;
  UA_UInt32 local_d8;
  UA_ListOfUASubscriptions local_d0;
  UA_PublishResponseEntry *pUStack_c8;
  UA_PublishResponseEntry **local_c0;
  undefined1 local_b8 [8];
  UA_NodeId requestTypeId;
  size_t local_88;
  size_t ppos;
  UA_DataType *local_78;
  UA_Server *local_70;
  UA_UInt32 local_64;
  ulong local_60;
  undefined8 local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  UA_DataType *local_38;
  
  request = (UA_CreateSessionRequest *)local_1c8;
  local_88 = 0;
  aUStack_1d0[0] = 0x1268d5;
  aUStack_1d0[1] = 0;
  UVar13 = UA_NodeId_decodeBinary(msg,&local_88,(UA_NodeId *)local_b8);
  if (UVar13 != 0) {
    return;
  }
  if (local_b8._4_4_ != UA_NODEIDTYPE_NUMERIC) {
    aUStack_1d0[0] = 0x1268f2;
    aUStack_1d0[1] = 0;
    UA_NodeId_deleteMembers((UA_NodeId *)local_b8);
  }
  sVar18 = local_88;
  ppos = local_88;
  local_70 = server;
  if (requestTypeId._0_4_ == 0x34f) {
    local_48 = Service_DeleteSubscriptions;
    pUVar19 = UA_TYPES + 0x48;
    local_38 = UA_TYPES + 0x7b;
    goto LAB_00126d63;
  }
  if (requestTypeId._0_4_ == 0x1ac) {
    local_48 = Service_GetEndpoints;
    pUVar19 = UA_TYPES + 0x6e;
    local_38 = UA_TYPES + 0x9c;
LAB_00126ad4:
    local_40 = (ulong)local_40._4_4_ << 0x20;
LAB_00126d6c:
    local_60 = 0;
LAB_00126d74:
    local_58 = (ulong)local_58._4_4_ << 0x20;
LAB_00126d7b:
    local_50 = (ulong)local_50._4_4_ << 0x20;
  }
  else {
    if (requestTypeId._0_4_ == 0x1cd) {
      local_48 = Service_CreateSession;
      pUVar19 = UA_TYPES + 0x99;
      local_60 = 0x11b101;
      local_38 = UA_TYPES + 0xa1;
      local_40 = (ulong)local_40._4_4_ << 0x20;
      goto LAB_00126d74;
    }
    if (requestTypeId._0_4_ == 0x1d3) {
      local_48 = Service_ActivateSession;
      pUVar19 = UA_TYPES + 0x53;
      local_38 = UA_TYPES + 0x58;
      local_40 = CONCAT44(local_40._4_4_,0x13c401);
      local_60 = 0;
      local_58 = CONCAT44(local_58._4_4_,0x13c401);
      goto LAB_00126d7b;
    }
    if (requestTypeId._0_4_ == 0x1d9) {
      local_48 = Service_CloseSession;
      pUVar19 = UA_TYPES + 99;
      local_38 = UA_TYPES + 0x8e;
LAB_00126d63:
      local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71((int7)((ulong)local_38 >> 8),1));
      goto LAB_00126d6c;
    }
    if (requestTypeId._0_4_ == 0x1e8) {
      local_48 = Service_AddNodes;
      pUVar19 = UA_TYPES + 0x95;
      local_38 = UA_TYPES + 0x70;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x1ee) {
      local_48 = Service_AddReferences;
      pUVar19 = UA_TYPES + 0x86;
      local_38 = UA_TYPES + 0x8a;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 500) {
      local_48 = Service_DeleteNodes;
      pUVar19 = UA_TYPES + 0x4d;
      local_38 = UA_TYPES + 0x80;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x1fa) {
      local_48 = Service_DeleteReferences;
      pUVar19 = UA_TYPES + 0x83;
      local_38 = UA_TYPES + 0x7d;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x20f) {
      local_48 = Service_Browse;
      pUVar19 = UA_TYPES + 0x96;
      local_38 = UA_TYPES + 0xa0;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x215) {
      local_48 = Service_BrowseNext;
      pUVar19 = UA_TYPES + 0x5c;
      local_38 = UA_TYPES + 0x9e;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x22a) {
      local_48 = Service_TranslateBrowsePathsToNodeIds;
      pUVar19 = UA_TYPES + 0x9f;
      local_38 = UA_TYPES + 0x8b;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x230) {
      local_48 = Service_RegisterNodes;
      pUVar19 = UA_TYPES + 0x4c;
      local_38 = UA_TYPES + 0x62;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x236) {
      local_48 = Service_UnregisterNodes;
      pUVar19 = UA_TYPES + 0x2a;
      local_38 = UA_TYPES + 0x69;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x277) {
      local_48 = Service_Read;
      pUVar19 = UA_TYPES + 0x87;
      local_38 = UA_TYPES + 0x85;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x2a1) {
      local_48 = Service_Write;
      pUVar19 = UA_TYPES + 0x6a;
      local_38 = UA_TYPES + 0x5b;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x2c8) {
      local_48 = Service_Call;
      pUVar19 = UA_TYPES + 0x30;
      local_38 = UA_TYPES + 0x7f;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x2ef) {
      local_48 = Service_CreateMonitoredItems;
      pUVar19 = UA_TYPES + 0x92;
      local_38 = UA_TYPES + 0x7e;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x2fb) {
      local_48 = Service_ModifyMonitoredItems;
      pUVar19 = UA_TYPES + 0x73;
      local_38 = UA_TYPES + 0x84;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x301) {
      local_48 = Service_SetMonitoringMode;
      pUVar19 = UA_TYPES + 0x68;
      local_38 = UA_TYPES + 0x74;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x30d) {
      local_48 = Service_DeleteMonitoredItems;
      pUVar19 = UA_TYPES + 0x66;
      local_38 = UA_TYPES + 0x4a;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x313) {
      local_48 = Service_CreateSubscription;
      pUVar19 = UA_TYPES + 0x5d;
      local_38 = UA_TYPES + 0x7a;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 0x319) {
      local_48 = Service_ModifySubscription;
      pUVar19 = UA_TYPES + 100;
      local_38 = UA_TYPES + 0x60;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ == 799) {
      local_48 = Service_SetPublishingMode;
      pUVar19 = UA_TYPES + 0x2e;
      local_38 = UA_TYPES + 0x77;
      goto LAB_00126d63;
    }
    if (requestTypeId._0_4_ != 0x33a) {
      if (requestTypeId._0_4_ != 0x340) {
        if (requestTypeId._0_4_ != 0x1a6) {
          if (channel->connection == (UA_Connection *)0x0) {
            uVar17 = 0;
          }
          else {
            uVar17 = (ulong)(uint)channel->connection->sockfd;
          }
          aUStack_1d0[0] = 0x127100;
          aUStack_1d0[1] = 0;
          UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                      "Connection %i | SecureChannel %i | Unknown request with type identifier %i",
                      uVar17,(ulong)(channel->securityToken).channelId);
          UVar13 = 0x800b0000;
          pUVar16 = UA_TYPES + 0x90;
          goto LAB_00126dc0;
        }
        local_48 = Service_FindServers;
        pUVar19 = UA_TYPES + 0x75;
        local_38 = UA_TYPES + 0x91;
        goto LAB_00126ad4;
      }
      local_48 = Service_Republish;
      pUVar19 = UA_TYPES + 0x6d;
      local_38 = UA_TYPES + 0x81;
      goto LAB_00126d63;
    }
    pUVar19 = UA_TYPES + 0x6f;
    local_38 = UA_TYPES + 0x4e;
    local_40 = CONCAT44(local_40._4_4_,0x13c201);
    local_60 = 0;
    local_58 = (ulong)local_58._4_4_ << 0x20;
    local_50 = CONCAT44(local_50._4_4_,0x13c201);
    local_48 = (code *)0x0;
  }
  lVar10 = -(ulong)(pUVar19->memSize + 0xf & 0xfffffff0);
  request = (UA_CreateSessionRequest *)(local_1c8 + lVar10);
  *(undefined8 *)((long)aUStack_1d0 + lVar10) = 0x126da8;
  UVar13 = UA_decodeBinary(msg,&local_88,request,pUVar19);
  pUVar16 = local_38;
  sVar18 = ppos;
  if (UVar13 != 0) {
LAB_00126dc0:
    *(undefined8 *)&request[-1].maxResponseMessageSize = 0x126dc5;
    sendError(channel,msg,sVar18,pUVar16,requestId,UVar13);
    return;
  }
  uVar5 = local_38->memSize;
  response = (UA_CreateSessionRequest *)((long)request - (ulong)(uVar5 + 0xf & 0xfffffff0));
  local_78 = pUVar19;
  local_64 = requestId;
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x126df4;
  memset(response,0,(ulong)uVar5);
  server_00 = local_70;
  if ((char)local_60 == '\0') {
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x126e1c;
    session = UA_SecureChannel_getSession(channel,(UA_NodeId *)request);
    if (session == (UA_Session *)0x0) {
      pUVar20 = &local_70->sessionManager;
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x126e34;
      session = UA_SessionManager_getSession(pUVar20,(UA_NodeId *)request);
    }
    pUVar16 = local_38;
    UVar11 = local_64;
    server_00 = local_70;
    pUVar19 = local_78;
    sVar18 = ppos;
    if ((char)local_58 == '\0') {
      if (session == (UA_Session *)0x0) {
        if ((char)local_40 != '\0') {
          p_Var7 = (local_70->config).logger;
          if (channel->connection == (UA_Connection *)0x0) {
            uVar17 = 0;
          }
          else {
            uVar17 = (ulong)(uint)channel->connection->sockfd;
          }
          uVar22 = (channel->securityToken).channelId;
          uVar5 = local_78->binaryEncodingId;
          *(undefined8 *)&response[-1].maxResponseMessageSize = 1;
          uVar9 = *(undefined8 *)&response[-1].maxResponseMessageSize;
          *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12715a;
          UA_LOG_INFO(p_Var7,(UA_LogCategory)uVar9,
                      "Connection %i | SecureChannel %i | Service request %i without a valid session"
                      ,uVar17,(ulong)uVar22,(ulong)uVar5);
          pUVar16 = local_38;
          UVar11 = local_64;
          *(undefined8 *)&response[-1].maxResponseMessageSize = 0x127176;
          sendError(channel,msg,sVar18,pUVar16,UVar11,0x80250000);
          goto LAB_001270b3;
        }
        uStack_158 = 0;
        uStack_157 = 0;
        pUStack_168 = (UA_Byte *)0x0;
        uStack_160 = 0;
        local_15f = 0;
        local_178 = (UA_Byte *)0x0;
        sStack_170 = 0;
        local_188._0_4_ = UA_APPLICATIONTYPE_SERVER;
        local_188._4_4_ = 0;
        sStack_180 = 0;
        local_198 = 0;
        pUStack_190 = (UA_Byte *)0x0;
        local_1a8[0] = 0;
        local_1a8[1] = 0;
        pUStack_1a0 = (UA_Byte *)0x0;
        local_1b8 = 0;
        pUStack_1b0 = (UA_Byte *)0x0;
        local_1c8._0_8_ = 0;
        local_1c8._8_8_ = (UA_Byte *)0x0;
        local_148 = 0;
        pUStack_140 = (UA_Byte *)0x0;
        local_138.namespaceIndex = 0;
        local_138._2_2_ = 0;
        local_138.identifierType = UA_NODEIDTYPE_NUMERIC;
        local_138.identifier.string.length = 0;
        local_138.identifier.string.data = (UA_Byte *)0x0;
        local_108._0_4_ = 0;
        local_108._4_4_ = 0;
        UStack_100 = 0.0;
        local_f8 = 0;
        local_e8 = 5;
        local_e0.lh_first = (ContinuationPointEntry *)0x0;
        local_d8 = 0;
        local_d0.lh_first = (UA_Subscription *)0x0;
        pUStack_c8 = (UA_PublishResponseEntry *)0x0;
        local_c0 = &pUStack_c8;
        UStack_120.namespaceIndex = 0;
        UStack_120._2_2_ = 0;
        UStack_120.identifierType = UA_NODEIDTYPE_GUID;
        UStack_120.identifier.string.length = 0;
        UStack_120.identifier.string.data = (UA_Byte *)0x0;
        local_f0 = channel;
        session = (UA_Session *)local_1c8;
      }
      else if (((char)local_40 != '\0') && (session->activated == false)) {
        p_Var7 = (local_70->config).logger;
        pUVar8 = session->channel;
        if (pUVar8 == (UA_SecureChannel *)0x0) {
          uVar17 = 0;
          uVar21 = 0;
        }
        else {
          if (pUVar8->connection == (UA_Connection *)0x0) {
            uVar17 = 0;
          }
          else {
            uVar17 = (ulong)(uint)pUVar8->connection->sockfd;
          }
          uVar21 = (ulong)(pUVar8->securityToken).channelId;
        }
        uVar22 = (session->sessionId).identifier.numeric;
        local_60 = (ulong)(session->sessionId).identifier.guid.data2;
        local_58 = (ulong)(session->sessionId).identifier.guid.data3;
        local_40 = (ulong)(session->sessionId).identifier.guid.data4[0];
        local_50 = (ulong)(session->sessionId).identifier.guid.data4[1];
        local_48 = (code *)(ulong)(session->sessionId).identifier.guid.data4[2];
        requestTypeId.identifier.string.data =
             (UA_Byte *)(ulong)(session->sessionId).identifier.guid.data4[3];
        bVar1 = (session->sessionId).identifier.guid.data4[4];
        bVar2 = (session->sessionId).identifier.guid.data4[5];
        bVar3 = (session->sessionId).identifier.guid.data4[6];
        bVar4 = (session->sessionId).identifier.guid.data4[7];
        uVar5 = local_78->binaryEncodingId;
        response[-1].requestedSessionTimeout = 9.88131291682493e-324;
        uVar9 = response[-1].requestedSessionTimeout;
        response[-1].requestedSessionTimeout = (UA_Double)(ulong)uVar5;
        response[-1].clientCertificate.data = (UA_Byte *)(ulong)bVar4;
        response[-1].clientCertificate.length = (ulong)bVar3;
        response[-1].clientNonce.data = (UA_Byte *)(ulong)bVar2;
        response[-1].clientNonce.length = (ulong)bVar1;
        response[-1].sessionName.data = requestTypeId.identifier.string.data;
        response[-1].sessionName.length = (size_t)local_48;
        response[-1].endpointUrl.data = (UA_Byte *)local_50;
        response[-1].endpointUrl.length = local_40;
        response[-1].serverUri.data = (UA_Byte *)local_58;
        response[-1].serverUri.length = local_60;
        response[-1].clientDescription.discoveryUrls = (UA_String *)0x127252;
        UA_LOG_INFO(p_Var7,(UA_LogCategory)uVar9,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Calling service %i on a non-activated session"
                    ,uVar17,uVar21,(ulong)uVar22);
        pUVar19 = local_38;
        UVar11 = local_64;
        sVar18 = ppos;
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x127273;
        sendError(channel,msg,sVar18,pUVar19,UVar11,0x80270000);
        pUVar20 = &local_70->sessionManager;
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12728a;
        UA_SessionManager_removeSession(pUVar20,&session->authenticationToken);
        pUVar19 = local_78;
        goto LAB_001270b3;
      }
      if (session->channel != channel) {
        UVar13 = 0x80220000;
        goto LAB_001270a7;
      }
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x1270cf;
      UA_Session_updateLifetime(session);
      pcVar12 = local_48;
      UVar11 = local_64;
      server_00 = local_70;
      if ((char)local_50 != '\0') {
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x1270e7;
        Service_Publish(server_00,session,(UA_PublishRequest *)request,UVar11);
        pUVar19 = local_78;
        goto LAB_001270b3;
      }
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x127131;
      (*pcVar12)(server_00,session,request,response);
    }
    else {
      if (session == (UA_Session *)0x0) {
        UVar13 = 0x80250000;
LAB_001270a7:
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x1270ac;
        sendError(channel,msg,sVar18,pUVar16,UVar11,UVar13);
        pUVar19 = local_78;
        goto LAB_001270b3;
      }
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x126e5e;
      Service_ActivateSession
                (server_00,channel,session,(UA_ActivateSessionRequest *)request,
                 (UA_ActivateSessionResponse *)response);
    }
  }
  else {
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x126e0f;
    Service_CreateSession(server_00,channel,request,(UA_CreateSessionResponse *)response);
  }
  ((UA_ResponseHeader *)&response->requestHeader)->requestHandle =
       *(UA_UInt32 *)((long)local_1a8 + lVar10);
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x126e6b;
  UVar14 = UA_DateTime_now();
  ((UA_ResponseHeader *)&response->requestHeader)->timestamp = UVar14;
  pUVar19 = local_38;
  UVar11 = local_64;
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x126e80;
  UVar13 = UA_SecureChannel_sendBinaryMessage(channel,UVar11,response,pUVar19);
  if (UVar13 != 0) {
    p_Var7 = (server_00->config).logger;
    if (channel->connection == (UA_Connection *)0x0) {
      uVar22 = 0;
    }
    else {
      uVar22 = channel->connection->sockfd;
    }
    uVar6 = (channel->securityToken).channelId;
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x126f00;
    pcVar15 = UA_StatusCode_name(UVar13);
    *(undefined8 *)&response[-1].maxResponseMessageSize = 1;
    uVar9 = *(undefined8 *)&response[-1].maxResponseMessageSize;
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x126f1d;
    UA_LOG_INFO(p_Var7,(UA_LogCategory)uVar9,
                "Connection %i | SecureChannel %i | Could not send the message over the SecureChannel with StatusCode %s"
                ,(ulong)uVar22,(ulong)uVar6,pcVar15);
  }
  pUVar19 = local_78;
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x126f29;
  UA_deleteMembers(request,pUVar19);
  pUVar19 = local_38;
  request = response;
LAB_001270b3:
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x1270b8;
  UA_deleteMembers(request,pUVar19);
  return;
}

Assistant:

static void
processMSG(UA_Server *server, UA_SecureChannel *channel,
           UA_UInt32 requestId, const UA_ByteString *msg) {
    /* At 0, the nodeid starts... */
    size_t ppos = 0;
    size_t *offset = &ppos;

    /* Decode the nodeid */
    UA_NodeId requestTypeId;
    UA_StatusCode retval = UA_NodeId_decodeBinary(msg, offset, &requestTypeId);
    if(retval != UA_STATUSCODE_GOOD)
        return;
    if(requestTypeId.identifierType != UA_NODEIDTYPE_NUMERIC)
        UA_NodeId_deleteMembers(&requestTypeId); /* leads to badserviceunsupported */

    /* Store the start-position of the request */
    size_t requestPos = *offset;

    /* Get the service pointers */
    UA_Service service = NULL;
    const UA_DataType *requestType = NULL;
    const UA_DataType *responseType = NULL;
    UA_Boolean sessionRequired = true;
    getServicePointers(requestTypeId.identifier.numeric, &requestType,
                       &responseType, &service, &sessionRequired);
    if(!requestType) {
        if(requestTypeId.identifier.numeric == 787) {
            UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                                "Client requested a subscription, " \
                                "but those are not enabled in the build");
        } else {
            UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                                "Unknown request with type identifier %i",
                                requestTypeId.identifier.numeric);
        }
        sendError(channel, msg, requestPos, &UA_TYPES[UA_TYPES_SERVICEFAULT],
                  requestId, UA_STATUSCODE_BADSERVICEUNSUPPORTED);
        return;
    }
    UA_assert(responseType);

#ifdef UA_ENABLE_NONSTANDARD_STATELESS
    /* Stateless extension: Sessions are optional */
    sessionRequired = false;
#endif

    /* Decode the request */
    void *request = UA_alloca(requestType->memSize);
    UA_RequestHeader *requestHeader = (UA_RequestHeader*)request;
    retval = UA_decodeBinary(msg, offset, request, requestType);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG_CHANNEL(server->config.logger, channel,
                             "Could not decode the request");
        sendError(channel, msg, requestPos, responseType, requestId, retval);
        return;
    }

    /* Prepare the respone */
    void *response = UA_alloca(responseType->memSize);
    UA_init(response, responseType);
    UA_Session *session = NULL; /* must be initialized before goto send_response */

    /* CreateSession doesn't need a session */
    if(requestType == &UA_TYPES[UA_TYPES_CREATESESSIONREQUEST]) {
        Service_CreateSession(server, channel, request, response);
        goto send_response;
    }

    /* Find the matching session */
    session = UA_SecureChannel_getSession(channel, &requestHeader->authenticationToken);
    if(!session)
        session = UA_SessionManager_getSession(&server->sessionManager,
                                               &requestHeader->authenticationToken);

    if(requestType == &UA_TYPES[UA_TYPES_ACTIVATESESSIONREQUEST]) {
        if(!session) {
            UA_LOG_DEBUG_CHANNEL(server->config.logger, channel,
                                 "Trying to activate a session that is " \
                                 "not known in the server");
            sendError(channel, msg, requestPos, responseType,
                      requestId, UA_STATUSCODE_BADSESSIONIDINVALID);
            UA_deleteMembers(request, requestType);
            return;
        }
        Service_ActivateSession(server, channel, session, request, response);
        goto send_response;
    }

    /* Set an anonymous, inactive session for services that need no session */
    UA_Session anonymousSession;
    if(!session) {
        if(sessionRequired) {
            UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                                "Service request %i without a valid session",
                                requestType->binaryEncodingId);
            sendError(channel, msg, requestPos, responseType,
                      requestId, UA_STATUSCODE_BADSESSIONIDINVALID);
            UA_deleteMembers(request, requestType);
            return;
        }
        UA_Session_init(&anonymousSession);
        anonymousSession.sessionId = UA_NODEID_GUID(0, UA_GUID_NULL);
        anonymousSession.channel = channel;
        session = &anonymousSession;
    }

    /* Trying to use a non-activated session? */
    if(sessionRequired && !session->activated) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "Calling service %i on a non-activated session",
                            requestType->binaryEncodingId);
        sendError(channel, msg, requestPos, responseType,
                  requestId, UA_STATUSCODE_BADSESSIONNOTACTIVATED);
        UA_SessionManager_removeSession(&server->sessionManager,
                                        &session->authenticationToken);
        UA_deleteMembers(request, requestType);
        return;
    }

    /* The session is bound to another channel */
    if(session->channel != channel) {
        UA_LOG_DEBUG_CHANNEL(server->config.logger, channel,
                             "Client tries to use an obsolete securechannel");
        sendError(channel, msg, requestPos, responseType,
                  requestId, UA_STATUSCODE_BADSECURECHANNELIDINVALID);
        UA_deleteMembers(request, requestType);
        return;
    }

    /* Update the session lifetime */
    UA_Session_updateLifetime(session);

#ifdef UA_ENABLE_SUBSCRIPTIONS
    /* The publish request is not answered immediately */
    if(requestType == &UA_TYPES[UA_TYPES_PUBLISHREQUEST]) {
        Service_Publish(server, session, request, requestId);
        UA_deleteMembers(request, requestType);
        return;
    }
#endif

    /* Call the service */
    UA_assert(service); /* For all services besides publish, the service pointer is non-NULL*/
    service(server, session, request, response);

 send_response:
    /* Send the response */
    ((UA_ResponseHeader*)response)->requestHandle = requestHeader->requestHandle;
    ((UA_ResponseHeader*)response)->timestamp = UA_DateTime_now();
    retval = UA_SecureChannel_sendBinaryMessage(channel, requestId, response, responseType);

    if(retval != UA_STATUSCODE_GOOD)
        UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                            "Could not send the message over the SecureChannel "
                            "with StatusCode %s", UA_StatusCode_name(retval));

    /* Clean up */
    UA_deleteMembers(request, requestType);
    UA_deleteMembers(response, responseType);
}